

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O2

void fio_json_on_string(json_parser_s *p,void *start,size_t length)

{
  byte bVar1;
  FIOBJ o;
  uint8_t *limit64;
  ulong uVar2;
  ulong **ppuVar3;
  ulong *puVar4;
  ulong *puVar5;
  long lVar6;
  ulong **ppuVar7;
  uint uVar8;
  ulong *puVar9;
  byte bVar10;
  uint uVar11;
  ulong *puVar12;
  long lStack_90;
  ulong *local_80;
  ulong *local_78;
  uint local_6c;
  ulong local_68;
  uint local_5c;
  FIOBJ local_58;
  fiobj_json_parser_s *local_50;
  fio_str_info_s local_48;
  
  local_50 = (fiobj_json_parser_s *)p;
  local_58 = fiobj_str_buf(length);
  fiobj_obj2cstr(&local_48,local_58);
  o = local_58;
  local_80 = (ulong *)local_48.data;
  puVar4 = (ulong *)local_48.data;
  if (0 < (long)length) {
    puVar12 = (ulong *)(length + (long)start);
    do {
      puVar4 = local_80;
      lVar6 = 0;
      puVar5 = local_80;
      puVar9 = (ulong *)start;
      while ((puVar9 < (ulong *)((long)puVar12 - 7U) &&
             (uVar2 = *puVar9 ^ 0xa3a3a3a3a3a3a3a3,
             ((uVar2 & 0x7f7f7f7f7f7f7f7f) + 0x101010101010101 & uVar2 & 0x8080808080808080) == 0)))
      {
        *puVar5 = *puVar9;
        puVar9 = puVar9 + 1;
        puVar5 = puVar5 + 1;
        lVar6 = lVar6 + 8;
      }
      while( true ) {
        if (puVar12 <= (ulong *)((long)start + lVar6)) {
          puVar4 = (ulong *)((long)local_80 + lVar6);
          goto LAB_00151867;
        }
        bVar10 = (byte)*(ulong *)((long)start + lVar6);
        if (bVar10 == 0x5c) break;
        *(byte *)((long)local_80 + lVar6) = bVar10;
        lVar6 = lVar6 + 1;
      }
      local_80 = (ulong *)((long)local_80 + lVar6);
      local_78 = (ulong *)((long)start + lVar6 + 1);
      bVar10 = (byte)*local_78;
      if (bVar10 - 0x30 < 8) {
        bVar1 = *(byte *)((long)start + lVar6 + 2);
        if ((bVar1 & 0xf8) != 0x30) goto switchD_00151538_caseD_6f;
        *(byte *)local_80 = bVar1 + bVar10 * '\b' + 0x50;
        lVar6 = 1;
        lStack_90 = 2;
LAB_0015151a:
        ppuVar3 = &local_80;
        ppuVar7 = &local_78;
        goto LAB_00151769;
      }
      switch(bVar10) {
      case 0x6e:
        *(byte *)local_80 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x76:
      case 0x77:
        goto switchD_00151538_caseD_6f;
      case 0x72:
        *(byte *)local_80 = 0xd;
        break;
      case 0x74:
        *(byte *)local_80 = 9;
        break;
      case 0x75:
        if (""[*(byte *)((long)start + lVar6 + 2)] != 0) {
          bVar1 = ""[*(byte *)((long)start + lVar6 + 3)];
          local_68 = (ulong)bVar1;
          if (((bVar1 != 0) &&
              (local_6c = (uint)""[*(byte *)((long)start + lVar6 + 4)], local_6c != 0)) &&
             (""[*(byte *)((long)start + lVar6 + 5)] != 0)) {
            uVar11 = ""[*(byte *)((long)start + lVar6 + 5)] - 1 | local_6c * 0x10 - 0x10;
            uVar8 = (bVar1 - 1 | (uint)""[*(byte *)((long)start + lVar6 + 2)] * 0x10 - 0x10) << 8 |
                    uVar11;
            if ((((*(byte *)((long)start + lVar6 + 6) == 0x5c) &&
                 (*(byte *)((long)start + lVar6 + 7) == 0x75)) &&
                ((local_68 = (ulong)(uint)""[*(byte *)((long)start + lVar6 + 8)],
                 ""[*(byte *)((long)start + lVar6 + 8)] != 0 &&
                 ((local_6c = (uint)""[*(byte *)((long)start + lVar6 + 9)], local_6c != 0 &&
                  (local_5c = (uint)""[*(byte *)((long)start + lVar6 + 10)], local_5c != 0)))))) &&
               (""[*(byte *)((long)start + lVar6 + 0xb)] != 0)) {
              uVar8 = (uVar8 & 0x3ff) * 0x400 +
                      ((""[*(byte *)((long)start + lVar6 + 0xb)] - 1 | local_5c * 0x10 + 0x3f0 |
                       (local_6c - 1) * 0x100) & 0x3ff) + 0x10000;
              local_78 = (ulong *)((long)start + lVar6 + 7);
LAB_0015180a:
              *(uint *)local_80 =
                   (uVar8 << 0x18 |
                   (uVar8 & 0x3fc0) << 10 | uVar8 >> 0x12 & 0xff | uVar8 >> 4 & 0xff00) & 0x3f3f3f07
                   | 0x808080f0;
              lStack_90 = 4;
            }
            else {
              bVar10 = (byte)uVar11;
              if (uVar8 < 0x80) {
                *(byte *)local_80 = bVar10;
                lStack_90 = 1;
              }
              else if (uVar8 < 0x800) {
                *(byte *)((long)puVar4 + lVar6) = (byte)(uVar8 >> 6) | 0xc0;
                *(byte *)((long)puVar4 + lVar6 + 1) = bVar10 & 0x3f | 0x80;
                lStack_90 = 2;
              }
              else {
                if (0xffff < uVar8) goto LAB_0015180a;
                *(byte *)((long)puVar4 + lVar6) = (byte)(uVar8 >> 0xc) | 0xe0;
                *(byte *)((long)puVar4 + lVar6 + 1) = (byte)(uVar8 >> 6) & 0x3f | 0x80;
                *(byte *)((long)puVar4 + lVar6 + 2) = bVar10 & 0x3f | 0x80;
                lStack_90 = 3;
              }
            }
            lVar6 = lStack_90;
            lStack_90 = 5;
            goto LAB_0015151a;
          }
        }
        goto switchD_00151538_caseD_6f;
      case 0x78:
        if ((""[*(byte *)((long)start + lVar6 + 2)] != '\0') &&
           (""[*(byte *)((long)start + lVar6 + 3)] != '\0')) {
          *(byte *)local_80 =
               ""[*(byte *)((long)start + lVar6 + 3)] - 1 |
               ""[*(byte *)((long)start + lVar6 + 2)] * '\x10' - 0x10;
          lStack_90 = 1;
          lVar6 = lStack_90;
          lStack_90 = 3;
          goto LAB_0015151a;
        }
switchD_00151538_caseD_6f:
        *(byte *)local_80 = bVar10;
        break;
      default:
        if (bVar10 == 0x66) {
          *(byte *)local_80 = 0xc;
        }
        else {
          if (bVar10 != 0x62) goto switchD_00151538_caseD_6f;
          *(byte *)local_80 = 8;
        }
      }
      ppuVar3 = &local_78;
      lVar6 = 1;
      ppuVar7 = &local_80;
      lStack_90 = lVar6;
LAB_00151769:
      *ppuVar3 = (ulong *)((long)*ppuVar3 + lVar6);
      *ppuVar7 = (ulong *)((long)*ppuVar7 + lStack_90);
      puVar4 = local_80;
      start = local_78;
    } while (local_78 < puVar12);
  }
LAB_00151867:
  fiobj_str_resize(local_58,(long)puVar4 - (long)local_48.data);
  fiobj_json_add2parser(local_50,o);
  return;
}

Assistant:

static void fio_json_on_string(json_parser_s *p, void *start, size_t length) {
  FIOBJ str = fiobj_str_buf(length);
  fiobj_str_resize(
      str, fio_json_unescape_str(fiobj_obj2cstr(str).data, start, length));
  fiobj_json_add2parser((fiobj_json_parser_s *)p, str);
}